

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl_io.cpp
# Opt level: O1

void __thiscall
OPLio::OPLwriteChannel(OPLio *this,uint regbase,uint channel,uchar data1,uchar data2)

{
  uint uVar1;
  undefined7 in_register_00000009;
  undefined3 in_register_00000081;
  
  uVar1 = OPLwriteChannel::op_num[channel % 9];
  (*this->_vptr_OPLio[4])
            (this,channel / 9,(ulong)(regbase + uVar1),CONCAT71(in_register_00000009,data1));
  (*this->_vptr_OPLio[4])
            (this,channel / 9,(ulong)(regbase + uVar1 + 3),
             (ulong)CONCAT31(in_register_00000081,data2));
  return;
}

Assistant:

void OPLio::OPLwriteChannel(uint regbase, uint channel, uchar data1, uchar data2)
{
	static const uint op_num[OPL2CHANNELS] = {
		0x00, 0x01, 0x02, 0x08, 0x09, 0x0A, 0x10, 0x11, 0x12};

	uint which = channel / OPL2CHANNELS;
	uint reg = regbase + op_num[channel % OPL2CHANNELS];
	OPLwriteReg (which, reg, data1);
	OPLwriteReg (which, reg+3, data2);
}